

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O3

void __thiscall brown::Tile::Tile(Tile *this,int x,int y,uint32_t fill)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  int iVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar8;
  
  this->p = x * 4;
  this->x = x;
  this->y = y;
  this->reserved = true;
  uVar4 = y * x;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)uVar4) {
    uVar3 = (ulong)uVar4 * 4;
  }
  pvVar2 = operator_new__(uVar3);
  this->f = (uintptr_t)pvVar2;
  auVar1 = _DAT_001081a0;
  if (0 < (int)uVar4) {
    lVar8 = (ulong)uVar4 - 1;
    auVar5._8_4_ = (int)lVar8;
    auVar5._0_8_ = lVar8;
    auVar5._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_001081a0;
    auVar7 = _DAT_00108180;
    auVar9 = _DAT_00108190;
    do {
      auVar10 = auVar9 ^ auVar1;
      iVar6 = auVar5._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar6 && auVar5._0_4_ < auVar10._0_4_ || iVar6 < auVar10._4_4_)
                & 1)) {
        *(uint32_t *)((long)pvVar2 + uVar3 * 4) = fill;
      }
      if ((auVar10._12_4_ != auVar5._12_4_ || auVar10._8_4_ <= auVar5._8_4_) &&
          auVar10._12_4_ <= auVar5._12_4_) {
        *(uint32_t *)((long)pvVar2 + uVar3 * 4 + 4) = fill;
      }
      auVar10 = auVar7 ^ auVar1;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar6 && (iVar11 != iVar6 || auVar10._0_4_ <= auVar5._0_4_)) {
        *(uint32_t *)((long)pvVar2 + uVar3 * 4 + 8) = fill;
        *(uint32_t *)((long)pvVar2 + uVar3 * 4 + 0xc) = fill;
      }
      uVar3 = uVar3 + 4;
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar8 + 4;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
    } while ((uVar4 + 3 & 0xfffffffc) != uVar3);
  }
  return;
}

Assistant:

Tile::Tile(int x, int y, std::uint32_t fill):
    Tile(x, y) {
    for (int i = 0; i <  x*y; i++) {
        reinterpret_cast<std::uint32_t*>(f)[i] = fill;
    }
}